

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void output_with_header(string *filename,string *header)

{
  ostream *poVar1;
  long *plVar2;
  ifstream f;
  undefined1 auStack_218 [16];
  streambuf local_208 [504];
  
  std::ifstream::ifstream(auStack_218,(string *)filename,_S_in);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"----- ",6);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(header->_M_dataplus)._M_p,header->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," -----",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_208);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1070f0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-----------------",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
  std::ostream::put(-0x10);
  std::ostream::flush();
  std::ifstream::~ifstream(auStack_218);
  return;
}

Assistant:

void output_with_header(const std::string& filename, const std::string& header) {
    std::ifstream f(filename);
    // Clear is needed if the file is empty.
    std::cout << "----- " << header << " -----" << std::endl;
    std::cout << f.rdbuf() << std::endl;
    std::cout.clear();
    std::cout << "-----------------" << std::endl;
}